

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chunked_sequence.hpp
# Opt level: O1

void __thiscall
pstore::chunked_sequence<int,_2UL,_4UL,_4UL>::chunk::shrink(chunk *this,size_t new_size)

{
  ulong index;
  
  if (this->size_ < new_size) {
    __assert_fail("new_size <= size_",
                  "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/adt/chunked_sequence.hpp"
                  ,0x1e8,
                  "void pstore::chunked_sequence<int, 2>::chunk::shrink(const std::size_t) [T = int, ElementsPerChunk = 2, ActualSize = 4, ActualAlign = 4]"
                 );
  }
  index = new_size;
  if (new_size < this->size_) {
    do {
      operator[](this,index);
      index = index + 1;
    } while (index < this->size_);
  }
  this->size_ = new_size;
  return;
}

Assistant:

void chunked_sequence<T, ElementsPerChunk, ActualSize, ActualAlign>::chunk::shrink (
        std::size_t const new_size) noexcept {
        assert (new_size <= size_);
        for (auto ctr = new_size; ctr < size_; ++ctr) {
            (*this)[ctr].~T ();
        }
        size_ = new_size;
    }